

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example6.cpp
# Opt level: O1

int main(void)

{
  undefined8 *****pppppuVar1;
  undefined8 *****pppppuVar2;
  in_addr_t iVar3;
  int iVar4;
  ostream *poVar5;
  int *piVar6;
  int iVar7;
  ulong uVar8;
  uint16_t destport;
  uint16_t portbase;
  int num;
  timespec req;
  string ipstr;
  timespec rem;
  RTPSessionParams sessparams;
  RTPUDPv4TransmissionParams transparams;
  RTPIPv4Address addr;
  MyRTPSession sess;
  int iStack_1094c;
  timespec tStack_10948;
  char *pcStack_10938;
  undefined8 uStack_10930;
  char cStack_10928;
  undefined7 uStack_10927;
  timespec tStack_10918;
  undefined1 auStack_10908 [128];
  _Alloc_hider _Stack_10888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_10878;
  RTPLibraryVersion RStack_10860;
  undefined2 uStack_10854;
  undefined8 uStack_10850;
  undefined8 ****ppppuStack_10848;
  undefined8 ****ppppuStack_10840;
  undefined8 uStack_10838;
  undefined1 uStack_10830;
  undefined8 uStack_1082c;
  undefined8 uStack_10824;
  undefined1 uStack_1081c;
  undefined4 uStack_1081b;
  undefined3 uStack_10817;
  undefined5 uStack_10814;
  undefined8 uStack_10808;
  RTPAddress RStack_10800;
  RTPSession RStack_107e8;
  
  jrtplib::RTPSession::RTPSession(&RStack_107e8,(RTPRandom *)0x0,(RTPMemoryManager *)0x0);
  pcStack_10938 = &cStack_10928;
  uStack_10930 = 0;
  cStack_10928 = '\0';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Using version ",0xe);
  RStack_10860 = jrtplib::RTPLibraryVersion::GetVersion();
  jrtplib::RTPLibraryVersion::GetVersionString_abi_cxx11_((string *)auStack_10908,&RStack_10860);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)CONCAT71(auStack_10908._1_7_,auStack_10908[0]),
                      auStack_10908._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((undefined1 *)CONCAT71(auStack_10908._1_7_,auStack_10908[0]) != auStack_10908 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(auStack_10908._1_7_,auStack_10908[0]),
                    auStack_10908._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter local portbase:",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter the destination IP address",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&pcStack_10938);
  iVar3 = inet_addr(pcStack_10938);
  if (iVar3 == 0xffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad IP address specified",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
    std::ostream::put(-0x18);
    iVar4 = -1;
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enter the destination port",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of packets you wish to be sent:",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,&iStack_1094c);
    RStack_10860 = (RTPLibraryVersion)ZEXT812(0x13ce90);
    uStack_10838 = 0;
    uStack_10854 = 5000;
    uStack_10850 = 0;
    uStack_10830 = 1;
    uStack_1082c = 0x800000008000;
    uStack_10824 = 0x800000008000;
    uStack_10808 = 0;
    uStack_1081c = 0;
    uStack_1081b = 0;
    uStack_10817 = 0;
    uStack_10814 = 0;
    ppppuStack_10848 = &ppppuStack_10848;
    ppppuStack_10840 = &ppppuStack_10848;
    jrtplib::RTPSessionParams::RTPSessionParams((RTPSessionParams *)auStack_10908);
    auStack_10908._16_8_ = 0x3fb999999999999a;
    auStack_10908[0] = true;
    uStack_1081c = 1;
    iVar4 = jrtplib::RTPSession::Create
                      (&RStack_107e8,(RTPSessionParams *)auStack_10908,
                       (RTPTransmissionParams *)&RStack_10860,IPv4UDPProto);
    checkerror(iVar4);
    RStack_10800._12_4_ =
         iVar3 >> 0x18 | (iVar3 & 0xff0000) >> 8 | (iVar3 & 0xff00) << 8 | iVar3 << 0x18;
    RStack_10800.addresstype = IPv4Address;
    RStack_10800._vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_0013dba0;
    iVar4 = jrtplib::RTPSession::AddDestination(&RStack_107e8,&RStack_10800);
    checkerror(iVar4);
    if (0 < iStack_1094c) {
      uVar8 = 1;
      do {
        iVar7 = (int)uVar8;
        printf("\nSending packet %d/%d\n",uVar8);
        iVar4 = jrtplib::RTPSession::SendPacket(&RStack_107e8,"1234567890",10,'\0',false,10);
        checkerror(iVar4);
        iVar4 = jrtplib::RTPSession::Poll(&RStack_107e8);
        checkerror(iVar4);
        tStack_10948.tv_sec = 1;
        tStack_10948.tv_nsec = 0;
        do {
          iVar4 = nanosleep(&tStack_10948,&tStack_10918);
          tStack_10948.tv_sec = tStack_10918.tv_sec;
          tStack_10948.tv_nsec = tStack_10918.tv_nsec;
          if (iVar4 != -1) break;
          piVar6 = __errno_location();
        } while (*piVar6 == 4);
        uVar8 = (ulong)(iVar7 + 1);
      } while (iVar7 < iStack_1094c);
    }
    tStack_10948.tv_sec = 0x4024000000000000;
    jrtplib::RTPSession::BYEDestroy(&RStack_107e8,(RTPTime *)&tStack_10948,(void *)0x0,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_10888._M_p != &aStack_10878) {
      operator_delete(_Stack_10888._M_p,aStack_10878._M_allocated_capacity + 1);
    }
    RStack_10860._0_8_ = &PTR__RTPUDPv4TransmissionParams_0013ce90;
    pppppuVar2 = (undefined8 *****)ppppuStack_10848;
    while (pppppuVar2 != &ppppuStack_10848) {
      pppppuVar1 = (undefined8 *****)*pppppuVar2;
      operator_delete(pppppuVar2,0x18);
      pppppuVar2 = pppppuVar1;
    }
    iVar4 = 0;
  }
  if (pcStack_10938 != &cStack_10928) {
    operator_delete(pcStack_10938,CONCAT71(uStack_10927,cStack_10928) + 1);
  }
  jrtplib::RTPSession::~RTPSession(&RStack_107e8);
  return iVar4;
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
	
	MyRTPSession sess;
	uint16_t portbase,destport;
	uint32_t destip;
	std::string ipstr;
	int status,i,num;

	std::cout << "Using version " << RTPLibraryVersion::GetVersion().GetVersionString() << std::endl;

	// First, we'll ask for the necessary information
		
	std::cout << "Enter local portbase:" << std::endl;
	std::cin >> portbase;
	std::cout << std::endl;
	
	std::cout << "Enter the destination IP address" << std::endl;
	std::cin >> ipstr;

	destip = inet_addr(ipstr.c_str());
	if (destip == INADDR_NONE)
	{
		std::cerr << "Bad IP address specified" << std::endl;
		return -1;
	}
	
	// The inet_addr function returns a value in network byte order, but
	// we need the IP address in host byte order, so we use a call to
	// ntohl
	destip = ntohl(destip);
	
	std::cout << "Enter the destination port" << std::endl;
	std::cin >> destport;
	
	std::cout << std::endl;
	std::cout << "Number of packets you wish to be sent:" << std::endl;
	std::cin >> num;

	// Now, we'll create a RTP session, set the destination, send some
	// packets and poll for incoming data.
	
	RTPUDPv4TransmissionParams transparams;
	RTPSessionParams sessparams;
	
	// IMPORTANT: The local timestamp unit MUST be set, otherwise
	//            RTCP Sender Report info will be calculated wrong
	// In this case, we'll be sending 10 samples each second, so we'll
	// put the timestamp unit to (1.0/10.0)
	sessparams.SetOwnTimestampUnit(1.0/10.0);		
	
	sessparams.SetAcceptOwnPackets(true);
	transparams.SetPortbase(portbase);
	
	// Let's also use RTCP multiplexing for this example
	transparams.SetRTCPMultiplexing(true); 

	status = sess.Create(sessparams,&transparams);	
	checkerror(status);
	
	// We're assuming that the destination is also using RTCP multiplexing 
	// ('true' means that the same port will be used for RTCP)
	RTPIPv4Address addr(destip,destport,true); 
	
	status = sess.AddDestination(addr);
	checkerror(status);
	
	for (i = 1 ; i <= num ; i++)
	{
		printf("\nSending packet %d/%d\n",i,num);
		
		// send the packet
		status = sess.SendPacket((void *)"1234567890",10,0,false,10);
		checkerror(status);

		// Either the background thread or the poll function itself will
		// cause the OnValidatedRTPPacket and OnRTCPSDESItem functions to
		// be called, so in this loop there's not much left to do. 
		
#ifndef RTP_SUPPORT_THREAD
		status = sess.Poll();
		checkerror(status);
#endif // RTP_SUPPORT_THREAD
		
		RTPTime::Wait(RTPTime(1,0));
	}
	
	sess.BYEDestroy(RTPTime(10,0),0,0);

#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}